

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

shared_ptr<Liby::TcpClient> __thiscall
Liby::EventLoopGroup::creatTcpClient(EventLoopGroup *this,string *host,string *service)

{
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Liby::TcpClient> sVar1;
  __weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> _Stack_80;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  weak_ptr<Liby::TcpClient> weakTcpClient;
  
  std::make_shared<Liby::TcpClient>();
  std::__weak_ptr<Liby::TcpClient,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<Liby::TcpClient,void>
            ((__weak_ptr<Liby::TcpClient,(__gnu_cxx::_Lock_policy)2> *)
             &weakTcpClient.super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::__weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&_Stack_80,&weakTcpClient.super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>
            );
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(string **)local_68._M_unused._0_8_ = host;
  *(element_type **)((long)local_68._M_unused._0_8_ + 8) = _Stack_80._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 0x10) =
       _Stack_80._M_refcount._M_pi;
  _Stack_80._M_ptr = (element_type *)0x0;
  _Stack_80._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_50 = std::
               _Function_handler<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:105:24)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:105:24)>
             ::_M_manager;
  Resolver::async_resolve(service,in_RCX,(ResolverHandler *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_80._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&weakTcpClient.super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::TcpClient>)
         sVar1.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TcpClient>
EventLoopGroup::creatTcpClient(const std::string &host,
                               const std::string &service) {
    std::shared_ptr<TcpClient> tcpClient = std::make_shared<TcpClient>();
    std::weak_ptr<TcpClient> weakTcpClient = tcpClient;

    Resolver::async_resolve(
        host, service, [this, weakTcpClient](std::list<Endpoint> eps) {
            if (weakTcpClient.expired() || eps.empty())
                return;

            auto tcpClient = weakTcpClient.lock();
            SockPtr sockPtr = std::make_shared<Socket>(eps.front());
            sockPtr->connect();

            EventLoop *loop = robinLoop1(sockPtr->fd());

            tcpClient->setEventLoop(loop);
            tcpClient->setSocket(sockPtr);

            // BUG tcpClient与当前线程不在一个线程上时,可能会引起内存错误
            //            tcpClient->start();
            // FIX
            if (loop == EventLoop::curr_thread_loop()) {
                tcpClient->start();
            } else {
                loop->runEventHandler([tcpClient] { tcpClient->start(); });
            }
        });
    return tcpClient;
}